

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_robust_access_pass.cpp
# Opt level: O3

Status __thiscall spvtools::opt::GraphicsRobustAccessPass::Process(GraphicsRobustAccessPass *this)

{
  Status SVar1;
  
  *(undefined8 *)&(this->super_Pass).field_0x34 = 0;
  ProcessCurrentModule(this);
  SVar1 = Failure;
  if ((this->super_Pass).field_0x35 == '\0') {
    SVar1 = (byte)(this->super_Pass).field_0x34 & 1 ^ SuccessWithoutChange;
  }
  return SVar1;
}

Assistant:

Pass::Status GraphicsRobustAccessPass::Process() {
  module_status_ = PerModuleState();

  ProcessCurrentModule();

  auto result = module_status_.failed
                    ? Status::Failure
                    : (module_status_.modified ? Status::SuccessWithChange
                                               : Status::SuccessWithoutChange);

  return result;
}